

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

void __thiscall
ska::detailv3::
sherwood_v3_table<const_slang::syntax::DefineDirectiveSyntax_*,_const_slang::syntax::DefineDirectiveSyntax_*,_std::hash<const_slang::syntax::DefineDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::DefineDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>_>
::rehash(sherwood_v3_table<const_slang::syntax::DefineDirectiveSyntax_*,_const_slang::syntax::DefineDirectiveSyntax_*,_std::hash<const_slang::syntax::DefineDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::DefineDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>_>
         *this,size_t num_buckets)

{
  char max_lookups;
  EntryPointer begin;
  int8_t iVar1;
  int8_t iVar2;
  size_t sVar3;
  sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*> *psVar4;
  long lVar5;
  long lVar6;
  anon_union_8_1_a8c68091_for_sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>_3 *key
  ;
  double dVar7;
  size_t local_38;
  
  dVar7 = ceil((((double)CONCAT44(0x45300000,(int)(this->num_elements >> 0x20)) -
                1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)this->num_elements) - 4503599627370496.0)) /
               (double)this->_max_load_factor);
  local_38 = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
  if (local_38 <= num_buckets) {
    local_38 = num_buckets;
  }
  if (local_38 != 0) {
    iVar1 = fibonacci_hash_policy::next_size_over(&this->hash_policy,&local_38);
    sVar3 = this->num_slots_minus_one;
    if (sVar3 != 0) {
      sVar3 = sVar3 + 1;
    }
    if (local_38 != sVar3) {
      iVar2 = compute_max_lookups(local_38);
      lVar6 = (long)iVar2;
      psVar4 = slang::
               StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>
               ::allocate(&this->
                           super_StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>
                          ,local_38 + lVar6);
      for (lVar5 = 0; local_38 * 0x10 + lVar6 * 0x10 + -0x10 != lVar5; lVar5 = lVar5 + 0x10) {
        (&psVar4->distance_from_desired)[lVar5] = -1;
      }
      psVar4[lVar6 + (local_38 - 1)].distance_from_desired = '\0';
      begin = this->entries;
      sVar3 = this->num_slots_minus_one;
      this->entries = psVar4;
      this->num_slots_minus_one = local_38 - 1;
      (this->hash_policy).shift = iVar1;
      max_lookups = this->max_lookups;
      this->max_lookups = iVar2;
      this->num_elements = 0;
      key = &begin->field_1;
      local_38 = sVar3;
      for (lVar5 = (long)max_lookups * 0x10 + sVar3 * 0x10; lVar5 != 0; lVar5 = lVar5 + -0x10) {
        if (-1 < ((sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*> *)(key + -1))->
                 distance_from_desired) {
          sherwood_v3_table<slang::syntax::DefineDirectiveSyntax_const*,slang::syntax::DefineDirectiveSyntax_const*,std::hash<slang::syntax::DefineDirectiveSyntax_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::DefineDirectiveSyntax_const*>>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::DefineDirectiveSyntax_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::DefineDirectiveSyntax_const*>,8ul>>
          ::emplace<slang::syntax::DefineDirectiveSyntax_const*>
                    ((sherwood_v3_table<slang::syntax::DefineDirectiveSyntax_const*,slang::syntax::DefineDirectiveSyntax_const*,std::hash<slang::syntax::DefineDirectiveSyntax_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::syntax::DefineDirectiveSyntax_const*>>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::DefineDirectiveSyntax_const*>,8ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::syntax::DefineDirectiveSyntax_const*>,8ul>>
                      *)this,&key->value);
          ((sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*> *)(key + -1))->
          distance_from_desired = -1;
        }
        key = key + 2;
      }
      deallocate_data(this,begin,local_38,max_lookups);
    }
    return;
  }
  reset_to_empty_state(this);
  return;
}

Assistant:

void rehash(size_t num_buckets)
    {
        num_buckets = std::max(num_buckets, static_cast<size_t>(std::ceil(num_elements / static_cast<double>(_max_load_factor))));
        if (num_buckets == 0)
        {
            reset_to_empty_state();
            return;
        }
        auto new_prime_index = hash_policy.next_size_over(num_buckets);
        if (num_buckets == bucket_count())
            return;
        int8_t new_max_lookups = compute_max_lookups(num_buckets);
        EntryPointer new_buckets(AllocatorTraits::allocate(*this, num_buckets + new_max_lookups));
        EntryPointer special_end_item = new_buckets + static_cast<ptrdiff_t>(num_buckets + new_max_lookups - 1);
        for (EntryPointer it = new_buckets; it != special_end_item; ++it)
            it->distance_from_desired = -1;
        special_end_item->distance_from_desired = Entry::special_end_value;
        std::swap(entries, new_buckets);
        std::swap(num_slots_minus_one, num_buckets);
        --num_slots_minus_one;
        hash_policy.commit(new_prime_index);
        int8_t old_max_lookups = max_lookups;
        max_lookups = new_max_lookups;
        num_elements = 0;
        for (EntryPointer it = new_buckets, end = it + static_cast<ptrdiff_t>(num_buckets + old_max_lookups); it != end; ++it)
        {
            if (it->has_value())
            {
                emplace(std::move(it->value));
                it->destroy_value();
            }
        }
        deallocate_data(new_buckets, num_buckets, old_max_lookups);
    }